

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-stm.c
# Opt level: O2

int lupdate(lua_State *L)

{
  rwlock *lock;
  rwlock copy;
  int iVar1;
  size_t in_RAX;
  undefined8 *puVar2;
  void *__dest;
  size_t __n;
  char *__src;
  rwlock rVar3;
  size_t sz;
  
  sz = in_RAX;
  puVar2 = (undefined8 *)lua_touserdata(L,1);
  iVar1 = lua_isuserdata(L,2);
  if (iVar1 == 0) {
    __src = luaL_checklstring(L,2,&sz);
    __n = sz;
    __dest = malloc(sz);
    memcpy(__dest,__src,__n);
  }
  else {
    __dest = lua_touserdata(L,2);
    __n = luaL_checkinteger(L,3);
    sz = __n;
  }
  lock = (rwlock *)*puVar2;
  rVar3 = (rwlock)stm_newcopy(__dest,(int32_t)__n);
  rwlock_wlock(lock);
  copy = lock[2];
  lock[2] = rVar3;
  lock->write = 0;
  stm_releasecopy((stm_copy *)copy);
  return 0;
}

Assistant:

static int
lupdate(lua_State *L) {
	struct boxstm * box = lua_touserdata(L, 1);
	void * msg;
	size_t sz;
	if (lua_isuserdata(L, 2)) {
		msg = lua_touserdata(L, 2);
		sz = (size_t)luaL_checkinteger(L, 3);
	} else {
		const char * tmp = luaL_checklstring(L,2,&sz);
		msg = skynet_malloc(sz);
		memcpy(msg, tmp, sz);
	}
	stm_update(box->obj, msg, sz);

	return 0;
}